

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder.cpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
* __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodePriceUpdate_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           *__return_storage_ptr__,PriceUpdateDecoder *this,ByteBuffer *buffer,
          IDataDictionary *data_dictionary)

{
  uint32_t uVar1;
  uint32_t fid_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_bool>
  pVar2;
  PriceField local_c0;
  undefined1 local_b0 [8];
  FieldDef field_def_1;
  undefined1 local_70 [8];
  FieldDef field_def;
  uint32_t referenced_fid;
  uint local_2c;
  uint32_t fid;
  uint32_t i;
  uint32_t size;
  IDataDictionary *data_dictionary_local;
  ByteBuffer *buffer_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  *price_map;
  
  uVar1 = tools::Varint::ReadU32((InputStream *)this);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::map(__return_storage_ptr__);
  for (local_2c = 0; local_2c < uVar1; local_2c = local_2c + 1) {
    fid_00 = tools::Varint::ReadU32((InputStream *)this);
    if (fid_00 == 0x7fffffff) {
      field_def._40_4_ = tools::Varint::ReadU32((InputStream *)this);
      GetFieldDef((FieldDef *)local_70,(ByteBuffer *)this,(IDataDictionary *)buffer,
                  __return_storage_ptr__,field_def._40_4_);
      pVar2 = std::
              map<std::__cxx11::string,bidfx_public_api::price::PriceField,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
              ::emplace<std::__cxx11::string&,bidfx_public_api::price::PriceField&>
                        ((map<std::__cxx11::string,bidfx_public_api::price::PriceField,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
                          *)__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &field_def,(PriceField *)PriceField::null);
      field_def_1._40_8_ = pVar2.first._M_node;
      FieldDef::~FieldDef((FieldDef *)local_70);
    }
    else {
      GetFieldDef((FieldDef *)local_b0,(ByteBuffer *)this,(IDataDictionary *)buffer,
                  __return_storage_ptr__,fid_00);
      DecodeField((PriceUpdateDecoder *)&local_c0,(ByteBuffer *)this,(FieldDef *)local_b0);
      std::
      map<std::__cxx11::string,bidfx_public_api::price::PriceField,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
      ::emplace<std::__cxx11::string&,bidfx_public_api::price::PriceField>
                ((map<std::__cxx11::string,bidfx_public_api::price::PriceField,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
                  *)__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field_def_1,
                 &local_c0);
      PriceField::~PriceField(&local_c0);
      FieldDef::~FieldDef((FieldDef *)local_b0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, PriceField> PriceUpdateDecoder::DecodePriceUpdate(ByteBuffer& buffer, IDataDictionary& data_dictionary)
{
    uint32_t size = Varint::ReadU32(buffer);
    std::map<std::string, PriceField> price_map;
    for (uint32_t i = 0; i < size; i++)
    {
        uint32_t fid = Varint::ReadU32(buffer);
        if (fid == FieldDef::REFERENCING_FID)
        {
            uint32_t referenced_fid = Varint::ReadU32(buffer);
            FieldDef field_def = GetFieldDef(buffer, data_dictionary, price_map, referenced_fid);
            price_map.emplace(field_def.name_, PriceField::null);
        }
        else
        {
            FieldDef field_def = GetFieldDef(buffer, data_dictionary, price_map, fid);
            price_map.emplace(field_def.name_, DecodeField(buffer, field_def));
        }
    }
    return price_map;
}